

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O2

void __thiscall n_e_s::core::Ppu::execute_vblank_scanline(Ppu *this)

{
  PpuRegisters *pPVar1;
  
  pPVar1 = this->registers_;
  if (((pPVar1->scanline == 0xf1) && (pPVar1->cycle == 1)) &&
     ((pPVar1->status).value_ = (pPVar1->status).value_ | 0x80, (char)(pPVar1->ctrl).value_ < '\0'))
  {
    std::function<void_()>::operator()(&this->on_nmi_);
    return;
  }
  return;
}

Assistant:

uint16_t &Ppu::scanline() {
    return registers_->scanline;
}